

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_abstract.c
# Opt level: O0

TA_RetCode TA_ForEachFunc(TA_CallForEachFunc functionToCall,void *opaqueData)

{
  uint uVar1;
  TA_FuncDef **ppTVar2;
  TA_FuncDef *pTVar3;
  undefined8 in_RSI;
  code *in_RDI;
  uint funcDefTableSize;
  uint j;
  uint i;
  TA_FuncInfo *funcInfo;
  TA_FuncDef *funcDef;
  TA_FuncDef **funcDefTable;
  uint local_38;
  uint local_34;
  TA_RetCode local_4;
  
  if (in_RDI == (code *)0x0) {
    local_4 = TA_BAD_PARAM;
  }
  else {
    for (local_34 = 0; local_34 < 0x1a; local_34 = local_34 + 1) {
      ppTVar2 = TA_DEF_Tables[local_34];
      uVar1 = *TA_DEF_TablesSize[local_34];
      for (local_38 = 0; local_38 < uVar1; local_38 = local_38 + 1) {
        pTVar3 = ppTVar2[local_38];
        if ((pTVar3 == (TA_FuncDef *)0x0) || (pTVar3->funcInfo == (TA_FuncInfo *)0x0)) {
          return TA_INTERNAL_ERROR|TA_ALLOC_ERR;
        }
        if (pTVar3->funcInfo == (TA_FuncInfo *)0x0) {
          return TA_INTERNAL_ERROR|TA_GROUP_NOT_FOUND;
        }
        (*in_RDI)(pTVar3->funcInfo,in_RSI);
      }
    }
    local_4 = TA_SUCCESS;
  }
  return local_4;
}

Assistant:

TA_RetCode TA_ForEachFunc( TA_CallForEachFunc functionToCall, void *opaqueData )
{
   const TA_FuncDef **funcDefTable;
   const TA_FuncDef *funcDef;
   const TA_FuncInfo *funcInfo;
   unsigned int i, j, funcDefTableSize;

   if( functionToCall == NULL )
   {
      return TA_BAD_PARAM;
   }

   /* Iterate the tables (each table is for one letter) */
   for( i=0; i < 26; i++ )
   {
      funcDefTable = TA_DEF_Tables[i];

      /* Identify the table size. */
      funcDefTableSize = *TA_DEF_TablesSize[i];
      for( j=0; j < funcDefTableSize; j++ )
      {
         funcDef = funcDefTable[j];
         if( !funcDef || !funcDef->funcInfo )
            return TA_INTERNAL_ERROR(3);

         funcInfo = funcDef->funcInfo;
         if( !funcInfo )
            return TA_INTERNAL_ERROR(4);
         (*functionToCall)( funcInfo, opaqueData );
      }
   }

   return TA_SUCCESS;
}